

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O2

string * duckdb::Bit::NumericToBit<unsigned_short>
                   (string *__return_storage_ptr__,unsigned_short numeric)

{
  unique_ptr<char[],_std::default_delete<char>,_false> buffer;
  anon_union_16_2_67f50693_for_value local_20;
  
  buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
  super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (unique_ptr<char[],_std::default_delete<char[]>_>)operator_new__(3);
  local_20.pointer.length = 3;
  local_20._7_8_ = 0;
  local_20.inlined.inlined[0xb] = '\0';
  local_20._4_2_ =
       *(undefined2 *)
        buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
        super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl;
  local_20.pointer.prefix[2] =
       *(char *)((long)buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>._M_t.
                       super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl + 2);
  NumericToBit<unsigned_short>(numeric,(bitstring_t *)&local_20.pointer);
  string_t::GetString_abi_cxx11_(__return_storage_ptr__,(string_t *)&local_20.pointer);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            (&buffer.super_unique_ptr<char[],_std::default_delete<char[]>_>);
  return __return_storage_ptr__;
}

Assistant:

string Bit::NumericToBit(T numeric) {
	auto bit_len = sizeof(T) + 1;
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(bit_len);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(bit_len));
	Bit::NumericToBit(numeric, output_str);
	return output_str.GetString();
}